

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O0

vector<EvaluationState,_std::allocator<EvaluationState>_> * __thiscall
PDA::eclose(vector<EvaluationState,_std::allocator<EvaluationState>_> *__return_storage_ptr__,
           PDA *this,vector<EvaluationState,_std::allocator<EvaluationState>_> *evaluations)

{
  _Map_pointer this_00;
  bool bVar1;
  char input;
  reference pEVar2;
  reference pvVar3;
  reference ppTVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  const_reference __x;
  State *currentStates;
  size_type sVar6;
  vector<EvaluationState,_std::allocator<EvaluationState>_> local_2a0;
  undefined4 local_284;
  undefined1 local_280 [8];
  EvaluationState state;
  iterator __end3;
  iterator __begin3;
  vector<EvaluationState,_std::allocator<EvaluationState>_> local_200;
  vector<EvaluationState,_std::allocator<EvaluationState>_> *local_1e8;
  vector<EvaluationState,_std::allocator<EvaluationState>_> *__range3;
  int local_184;
  undefined1 local_180 [4];
  int j;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  newStack;
  Transition *transition;
  iterator __end2;
  iterator __begin2;
  vector<Transition_*,_std::allocator<Transition_*>_> local_f8;
  vector<Transition_*,_std::allocator<Transition_*>_> *local_e0;
  vector<Transition_*,_std::allocator<Transition_*>_> *__range2;
  vector<EvaluationState,_std::allocator<EvaluationState>_> recentEvaluations;
  undefined1 local_b0 [8];
  EvaluationState evaluation;
  iterator __end1;
  iterator __begin1;
  vector<EvaluationState,_std::allocator<EvaluationState>_> *__range1;
  vector<EvaluationState,_std::allocator<EvaluationState>_> newEvaluations;
  bool addedSomething;
  vector<EvaluationState,_std::allocator<EvaluationState>_> *evaluations_local;
  PDA *this_local;
  
  newEvaluations.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::vector
            ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)&__range1);
  __end1 = std::vector<EvaluationState,_std::allocator<EvaluationState>_>::begin(evaluations);
  evaluation.currentStates =
       (State *)std::vector<EvaluationState,_std::allocator<EvaluationState>_>::end(evaluations);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<EvaluationState_*,_std::vector<EvaluationState,_std::allocator<EvaluationState>_>_>
                                *)&evaluation.currentStates);
    if (!bVar1) break;
    pEVar2 = __gnu_cxx::
             __normal_iterator<EvaluationState_*,_std::vector<EvaluationState,_std::allocator<EvaluationState>_>_>
             ::operator*(&__end1);
    EvaluationState::EvaluationState((EvaluationState *)local_b0,pEVar2);
    __range2 = (vector<Transition_*,_std::allocator<Transition_*>_> *)0x0;
    recentEvaluations.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    recentEvaluations.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<EvaluationState,_std::allocator<EvaluationState>_>::vector
              ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)&__range2);
    this_00 = evaluation.stack.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    input = getEPSILON();
    pvVar3 = std::
             stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::top((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_b0);
    std::__cxx11::string::string((string *)&__begin2,(string *)pvVar3);
    State::getTransitionsOnInput(&local_f8,(State *)this_00,input,(string *)&__begin2);
    std::__cxx11::string::~string((string *)&__begin2);
    local_e0 = &local_f8;
    __end2 = std::vector<Transition_*,_std::allocator<Transition_*>_>::begin(local_e0);
    transition = (Transition *)
                 std::vector<Transition_*,_std::allocator<Transition_*>_>::end(local_e0);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<Transition_**,_std::vector<Transition_*,_std::allocator<Transition_*>_>_>
                                  *)&transition);
      if (!bVar1) break;
      ppTVar4 = __gnu_cxx::
                __normal_iterator<Transition_**,_std::vector<Transition_*,_std::allocator<Transition_*>_>_>
                ::operator*(&__end2);
      newStack.c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)*ppTVar4;
      std::
      stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::stack((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_180,
              (stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_b0);
      pvVar5 = Transition::getStackPush_abi_cxx11_
                         ((Transition *)
                          newStack.c.
                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_node);
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvVar5);
      local_184 = (int)sVar6;
      while (local_184 = local_184 + -1, -1 < local_184) {
        pvVar5 = Transition::getStackPush_abi_cxx11_
                           ((Transition *)
                            newStack.c.
                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_node);
        __x = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](pvVar5,(long)local_184);
        std::
        stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_180,__x);
      }
      currentStates =
           Transition::getStateTo
                     ((Transition *)
                      newStack.c.
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node);
      EvaluationState::EvaluationState
                ((EvaluationState *)&__range3,
                 (stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_180,currentStates);
      std::vector<EvaluationState,_std::allocator<EvaluationState>_>::emplace_back<EvaluationState>
                ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)&__range2,
                 (EvaluationState *)&__range3);
      EvaluationState::~EvaluationState((EvaluationState *)&__range3);
      std::
      stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~stack((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_180);
      __gnu_cxx::
      __normal_iterator<Transition_**,_std::vector<Transition_*,_std::allocator<Transition_*>_>_>::
      operator++(&__end2);
    }
    std::vector<Transition_*,_std::allocator<Transition_*>_>::~vector(&local_f8);
    sVar6 = std::vector<EvaluationState,_std::allocator<EvaluationState>_>::size
                      ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)&__range2);
    if (sVar6 != 0) {
      std::vector<EvaluationState,_std::allocator<EvaluationState>_>::vector
                ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)&__begin3,
                 (vector<EvaluationState,_std::allocator<EvaluationState>_> *)&__range2);
      eclose(&local_200,this,(vector<EvaluationState,_std::allocator<EvaluationState>_> *)&__begin3)
      ;
      std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector
                ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)&__begin3);
      local_1e8 = &local_200;
      __end3 = std::vector<EvaluationState,_std::allocator<EvaluationState>_>::begin(local_1e8);
      state.currentStates =
           (State *)std::vector<EvaluationState,_std::allocator<EvaluationState>_>::end(local_1e8);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<EvaluationState_*,_std::vector<EvaluationState,_std::allocator<EvaluationState>_>_>
                                    *)&state.currentStates);
        if (!bVar1) break;
        pEVar2 = __gnu_cxx::
                 __normal_iterator<EvaluationState_*,_std::vector<EvaluationState,_std::allocator<EvaluationState>_>_>
                 ::operator*(&__end3);
        EvaluationState::EvaluationState((EvaluationState *)local_280,pEVar2);
        std::vector<EvaluationState,std::allocator<EvaluationState>>::emplace_back<EvaluationState&>
                  ((vector<EvaluationState,std::allocator<EvaluationState>> *)&__range1,
                   (EvaluationState *)local_280);
        EvaluationState::~EvaluationState((EvaluationState *)local_280);
        __gnu_cxx::
        __normal_iterator<EvaluationState_*,_std::vector<EvaluationState,_std::allocator<EvaluationState>_>_>
        ::operator++(&__end3);
      }
      std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector(&local_200);
    }
    std::vector<EvaluationState,std::allocator<EvaluationState>>::emplace_back<EvaluationState&>
              ((vector<EvaluationState,std::allocator<EvaluationState>> *)&__range1,
               (EvaluationState *)local_b0);
    std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector
              ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)&__range2);
    EvaluationState::~EvaluationState((EvaluationState *)local_b0);
    __gnu_cxx::
    __normal_iterator<EvaluationState_*,_std::vector<EvaluationState,_std::allocator<EvaluationState>_>_>
    ::operator++(&__end1);
  }
  if ((newEvaluations.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    std::vector<EvaluationState,_std::allocator<EvaluationState>_>::vector
              (__return_storage_ptr__,
               (vector<EvaluationState,_std::allocator<EvaluationState>_> *)&__range1);
  }
  else {
    std::vector<EvaluationState,_std::allocator<EvaluationState>_>::vector
              (&local_2a0,(vector<EvaluationState,_std::allocator<EvaluationState>_> *)&__range1);
    eclose(__return_storage_ptr__,this,&local_2a0);
    std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector(&local_2a0);
  }
  local_284 = 1;
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector
            ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

std::vector<EvaluationState> PDA::eclose(std::vector<EvaluationState> evaluations) {
    bool addedSomething = false;
    std::vector<EvaluationState> newEvaluations;
    for (EvaluationState evaluation: evaluations) {
        std::vector<EvaluationState> recentEvaluations = {};
        for (Transition *transition: evaluation.currentStates->getTransitionsOnInput(getEPSILON(), evaluation.stack.top())) {
            std::stack<std::string> newStack = evaluation.stack;
            for (int j = transition->getStackPush().size() - 1; j >= 0; --j) {
//                if (transition->getStackPush()[j] != "e") { // e is epsilon, so nothing has to be pushed then
                    newStack.push(transition->getStackPush()[j]);
//                }
            }
            recentEvaluations.emplace_back(EvaluationState(newStack, transition->getStateTo()));
        }

        if (recentEvaluations.size() > 0) {
            for (EvaluationState state: eclose(recentEvaluations)) {
                newEvaluations.emplace_back(state);
            }
        }
        newEvaluations.emplace_back(evaluation);
    }
    if (!addedSomething) {
        return newEvaluations;
    }

    return eclose(newEvaluations);
}